

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O1

Am_Value from_sibling_procedure(Am_Object *self)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar4;
  Am_Slot_Key in_SI;
  Am_Value AVar5;
  Am_Object AStack_28;
  Am_Object local_20;
  long *plVar3;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  iVar2 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  Am_Object::Get_Object(&AStack_28,in_SI,10);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&AStack_28,(ulong)*(ushort *)((long)plVar3 + 0xc));
  in_value = Am_Object::Get(&local_20,*(Am_Slot_Key *)((long)plVar3 + 0xe),0);
  Am_Value::operator=((Am_Value *)self,in_value);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&AStack_28);
  plVar1 = plVar3 + 1;
  *(int *)plVar1 = (int)*plVar1 + -1;
  aVar4 = extraout_RDX;
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar3 + 0x20))(plVar3);
    aVar4 = extraout_RDX_00;
  }
  AVar5.value.wrapper_value = aVar4.wrapper_value;
  AVar5._0_8_ = self;
  return AVar5;
}

Assistant:

static Am_Value
from_sibling_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Store_Data *store =
      (Part_Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = self.Get_Owner().Get_Object(store->part).Get(store->key);
  store->Release();
  return value;
}